

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall corr_stack::corr_stack(corr_stack *this,vmdict_TrieNode *root)

{
  void *pvVar1;
  corr_state *in_RSI;
  vmdict_TrieNode *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pvVar1 = corr_state::operator_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  corr_state::corr_state(in_RSI,in_RDI);
  *(void **)in_RDI = pvVar1;
  return;
}

Assistant:

corr_stack(vmdict_TrieNode *root)
    {
        /* start the stack with an empty initial state */
        top = new (0) corr_state(root);
    }